

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O0

size_t __thiscall
CCharmapToLocalUcs2Big::map
          (CCharmapToLocalUcs2Big *this,wchar_t unicode_char,char **output_ptr,size_t *output_len)

{
  size_t *output_len_local;
  char **output_ptr_local;
  wchar_t unicode_char_local;
  CCharmapToLocalUcs2Big *this_local;
  
  if (*output_len < 2) {
    *output_len = 0;
  }
  else {
    **output_ptr = (char)((uint)unicode_char >> 8);
    (*output_ptr)[1] = (char)unicode_char;
    *output_ptr = *output_ptr + 2;
    *output_len = *output_len - 2;
  }
  return 2;
}

Assistant:

size_t CCharmapToLocalUcs2Big::map(wchar_t unicode_char, char **output_ptr,
                                   size_t *output_len) const
{
    /* 
     *   If we don't have room for another byte pair, abort.  Note that we
     *   really do want to store exactly two bytes, not sizeof(anything),
     *   since we're storing to the UCS-2 file format, which encodes each
     *   character in two bytes.  
     */
    if (*output_len < 2)
    {
        *output_len = 0;
        return 2;
    }

    /*
     *   Store the big-endian 16-bit value with no translation - unicode
     *   is the same everywhere.
     *   
     *   Note that the need to perform this trivial translation for this
     *   character set is a secondary reason that this routine is virtual
     *   (the primary reason is to handle the default ASCII translation).
     *   
     *   Store the high-order 8 bits in the first byte, and the low-order
     *   8 bits in the second byte.  
     */
    **output_ptr = ((unicode_char >> 8) & 0xff);
    *(*output_ptr + 1) = (unicode_char & 0xff);

    /* skip two bytes in the output */
    *output_ptr += 2;
    *output_len -= 2;

    /* return the size of the result */
    return 2;
}